

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O3

bool bssl::anon_unknown_12::FileTestReadInt<unsigned_short>
               (FileTest *file_test,unsigned_short *out,string *key)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  ushort uVar4;
  string s;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar2 = FileTest::GetAttribute(file_test,&local_30,key);
  if (bVar2) {
    if (local_30._M_string_length == 0) {
      uVar4 = 0;
    }
    else {
      sVar3 = 0;
      uVar4 = 0;
      do {
        bVar1 = local_30._M_dataplus._M_p[sVar3];
        if (((byte)(bVar1 - 0x3a) < 0xf6) || ((ushort)(0x2f - bVar1) / 10 < uVar4))
        goto LAB_00307cdc;
        uVar4 = (uVar4 * 10 + (ushort)bVar1) - 0x30;
        sVar3 = sVar3 + 1;
      } while (local_30._M_string_length != sVar3);
    }
    *out = uVar4;
    bVar2 = true;
  }
  else {
LAB_00307cdc:
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool FileTestReadInt(FileTest *file_test, T *out, const std::string &key) {
  std::string s;
  return file_test->GetAttribute(&s, key) && ParseIntSafe(out, s);
}